

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

void usage(int argc,char **argv)

{
  undefined4 in_register_0000003c;
  
  fprintf(_stderr,
          "usage: %s [options] <in.gb>\n  -h,--help          help\n  -t,--trace         trace each instruction\n  -f,--font-scale=F  set the global font scale factor to F\n  -l,--log S=N       set log level for system S to N\n\n  -p,--pause         pause at start\n  -s,--seed=SEED     random seed used for initializing RAM\n  -P,--palette PAL   use a builtin palette for DMG\n  -C,--cgb-color COLOR    cgb color curve to use\n                            0: none\n                            1: Sameboy (Emulate Hardware)\n                            2: Gambatte/Gameboy Online\n     --force-dmg     force running as a DMG (original gameboy)\n     --sgb-border    draw the super gameboy border\n"
          ,*(undefined8 *)CONCAT44(in_register_0000003c,argc));
  emulator_print_log_systems();
  return;
}

Assistant:

static void usage(int argc, char** argv) {
  PRINT_ERROR(
      "usage: %s [options] <in.gb>\n"
      "  -h,--help          help\n"
      "  -t,--trace         trace each instruction\n"
      "  -f,--font-scale=F  set the global font scale factor to F\n"
      "  -l,--log S=N       set log level for system S to N\n\n"
      "  -p,--pause         pause at start\n"
      "  -s,--seed=SEED     random seed used for initializing RAM\n"
      "  -P,--palette PAL   use a builtin palette for DMG\n"
      "  -C,--cgb-color COLOR    cgb color curve to use\n"
      "                            0: none\n"
      "                            1: Sameboy (Emulate Hardware)\n"
      "                            2: Gambatte/Gameboy Online\n"
      "     --force-dmg     force running as a DMG (original gameboy)\n"
      "     --sgb-border    draw the super gameboy border\n",
      argv[0]);

  emulator_print_log_systems();
}